

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::RoundCase::compare(RoundCase *this,void **inputs,void **outputs)

{
  float a;
  bool bVar1;
  uint value;
  int numAccurateBits;
  deUint32 value_00;
  deUint32 dVar2;
  reference pvVar3;
  ostream *poVar4;
  Hex<8UL> HVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  deUint32 local_e4;
  deUint32 local_c8;
  deUint32 local_c4;
  int local_a8;
  deUint32 ulpDiff_1;
  int roundedVal;
  bool anyOk;
  int maxRes;
  int minRes;
  float out0_1;
  float in0_1;
  int compNdx_1;
  float eps;
  deUint32 maxUlpDiff;
  int mantissaBits;
  HexFloat local_74;
  deUint32 local_70;
  float local_6c;
  deUint32 ulpDiff;
  float ref;
  HexFloat local_5c;
  HexFloat local_58;
  deUint32 local_54;
  deUint32 local_50;
  deUint32 ulpDiff1;
  deUint32 ulpDiff0;
  float ref1;
  float ref0;
  float out0;
  float in0;
  int compNdx;
  int scalarSize;
  DataType DStack_2c;
  bool hasZeroSign;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  RoundCase *this_local;
  
  _precision = outputs;
  outputs_local = inputs;
  inputs_local = (void **)this;
  pvVar3 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_CommonFunctionCase).m_spec.inputs,0);
  DStack_2c = glu::VarType::getBasicType(&pvVar3->varType);
  pvVar3 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_CommonFunctionCase).m_spec.inputs,0);
  scalarSize = glu::VarType::getPrecision(&pvVar3->varType);
  compNdx._3_1_ = supportsSignedZero(scalarSize);
  in0 = (float)glu::getDataTypeScalarSize(DStack_2c);
  if ((scalarSize == 2) || (scalarSize == 1)) {
    for (out0 = 0.0; (int)out0 < (int)in0; out0 = (float)((int)out0 + 1)) {
      ref0 = *(float *)((long)*outputs_local + (long)(int)out0 * 4);
      ref1 = *(float *)((long)*_precision + (long)(int)out0 * 4);
      fVar6 = deFloatFrac(ref0);
      if ((fVar6 != 0.5) || (NAN(fVar6))) {
        local_6c = roundEven(ref0);
        if ((compNdx._3_1_ & 1) == 0) {
          local_e4 = getUlpDiffIgnoreZeroSign(ref1,local_6c);
        }
        else {
          local_e4 = getUlpDiff(ref1,local_6c);
        }
        local_70 = local_e4;
        if (local_e4 != 0) {
          poVar4 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                    super_basic_ostream<char,_std::char_traits<char>_>,"Expected [")
          ;
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)out0);
          poVar4 = std::operator<<(poVar4,"] = ");
          HexFloat::HexFloat(&local_74,local_6c);
          poVar4 = Functional::operator<<(poVar4,&local_74);
          poVar4 = std::operator<<(poVar4,", got ULP diff ");
          HVar5 = tcu::toHex<unsigned_int>(local_70);
          tcu::Format::operator<<(poVar4,HVar5);
          return false;
        }
      }
      else {
        ulpDiff0 = (deUint32)::deFloatFloor(ref0);
        ulpDiff1 = (deUint32)::deFloatCeil(ref0);
        if ((compNdx._3_1_ & 1) == 0) {
          local_c4 = getUlpDiffIgnoreZeroSign(ref1,(float)ulpDiff0);
        }
        else {
          local_c4 = getUlpDiff(ref1,(float)ulpDiff0);
        }
        local_50 = local_c4;
        if ((compNdx._3_1_ & 1) == 0) {
          local_c8 = getUlpDiffIgnoreZeroSign(ref1,(float)ulpDiff1);
        }
        else {
          local_c8 = getUlpDiff(ref1,(float)ulpDiff1);
        }
        local_54 = local_c8;
        if ((local_50 != 0) && (local_c8 != 0)) {
          poVar4 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                    super_basic_ostream<char,_std::char_traits<char>_>,"Expected [")
          ;
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)out0);
          poVar4 = std::operator<<(poVar4,"] = ");
          HexFloat::HexFloat(&local_58,(float)ulpDiff0);
          poVar4 = Functional::operator<<(poVar4,&local_58);
          poVar4 = std::operator<<(poVar4," or ");
          HexFloat::HexFloat(&local_5c,(float)ulpDiff1);
          poVar4 = Functional::operator<<(poVar4,&local_5c);
          poVar4 = std::operator<<(poVar4,", got ULP diff ");
          value = de::min<unsigned_int>(local_50,local_54);
          _ulpDiff = tcu::toHex<unsigned_int>(value);
          tcu::Format::operator<<(poVar4,_ulpDiff);
          return false;
        }
      }
    }
  }
  else {
    numAccurateBits = getMinMantissaBits(scalarSize);
    value_00 = getMaxUlpDiffFromBits(numAccurateBits);
    fVar6 = getEpsFromBits(1.0,numAccurateBits);
    for (out0_1 = 0.0; (int)out0_1 < (int)in0; out0_1 = (float)((int)out0_1 + 1)) {
      fVar8 = *(float *)((long)*outputs_local + (long)(int)out0_1 * 4);
      a = *(float *)((long)*_precision + (long)(int)out0_1 * 4);
      fVar7 = roundEven(fVar8 - fVar6);
      fVar8 = roundEven(fVar8 + fVar6);
      bVar1 = false;
      for (local_a8 = (int)fVar7; local_a8 <= (int)fVar8; local_a8 = local_a8 + 1) {
        dVar2 = getUlpDiffIgnoreZeroSign(a,(float)local_a8);
        if (dVar2 <= value_00) {
          bVar1 = true;
          break;
        }
      }
      if (!bVar1) {
        poVar4 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                  super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)out0_1);
        poVar4 = std::operator<<(poVar4,"] = [");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)fVar7);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)fVar8);
        poVar4 = std::operator<<(poVar4,"] with ULP threshold ");
        HVar5 = tcu::toHex<unsigned_int>(value_00);
        tcu::Format::operator<<(poVar4,HVar5);
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasZeroSign		= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];

				if (deFloatFrac(in0) == 0.5f)
				{
					// Allow both ceil(in) and floor(in)
					const float		ref0		= deFloatFloor(in0);
					const float		ref1		= deFloatCeil(in0);
					const deUint32	ulpDiff0	= hasZeroSign ? getUlpDiff(out0, ref0) : getUlpDiffIgnoreZeroSign(out0, ref0);
					const deUint32	ulpDiff1	= hasZeroSign ? getUlpDiff(out0, ref1) : getUlpDiffIgnoreZeroSign(out0, ref1);

					if (ulpDiff0 > 0 && ulpDiff1 > 0)
					{
						m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref0) << " or " << HexFloat(ref1) << ", got ULP diff " << tcu::toHex(de::min(ulpDiff0, ulpDiff1));
						return false;
					}
				}
				else
				{
					// Require exact result
					const float		ref		= roundEven(in0);
					const deUint32	ulpDiff	= hasZeroSign ? getUlpDiff(out0, ref) : getUlpDiffIgnoreZeroSign(out0, ref);

					if (ulpDiff > 0)
					{
						m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
						return false;
					}
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(roundEven(in0-eps));
				const int		maxRes		= int(roundEven(in0+eps));
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiffIgnoreZeroSign(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}